

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

size_t __thiscall TestRange<bool>::getSteps(TestRange<bool> *this)

{
  ulong uVar1;
  int *in_RDI;
  __type _Var2;
  __type _Var3;
  double dVar4;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  double steps_double;
  ssize_t coe;
  size_type local_8;
  
  if (*in_RDI == 1) {
    local_8 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
  }
  else if (*in_RDI == 2) {
    local_8 = (size_type)
              ((int)((uint)(*(byte *)((long)in_RDI + 0x31) & 1) -
                    (uint)(*(byte *)(in_RDI + 0xc) & 1)) /
               (int)(uint)(*(byte *)((long)in_RDI + 0x32) & 1) + 1);
  }
  else if (*in_RDI == 3) {
    _Var2 = std::log<long>(0x219ec2);
    _Var3 = std::log<bool>(false);
    dVar4 = _Var2 / _Var3 + 1.0;
    uVar1 = (ulong)dVar4;
    local_8 = uVar1 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t getSteps() {
        if (type == RangeType::ARRAY) {
            return array.size();
        } else if (type == RangeType::LINEAR) {
            return ((end - begin) / step) + 1;
        } else if (type == RangeType::EXPONENTIAL) {
            ssize_t coe = ((ssize_t)end) / ((ssize_t)begin);
            double steps_double = (double)std::log(coe) / std::log(step);
            return (size_t)(steps_double + 1);
        }

        return 0;
    }